

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O0

void rlBegin(int mode)

{
  _Bool _Var1;
  int local_14;
  int local_10;
  int mode_local;
  
  if ((RLGL.currentBatch)->draws[(RLGL.currentBatch)->drawsCounter + -1].mode != mode) {
    if (0 < (RLGL.currentBatch)->draws[(RLGL.currentBatch)->drawsCounter + -1].vertexCount) {
      if ((RLGL.currentBatch)->draws[(RLGL.currentBatch)->drawsCounter + -1].mode == 1) {
        if ((RLGL.currentBatch)->draws[(RLGL.currentBatch)->drawsCounter + -1].vertexCount < 4) {
          local_10 = (RLGL.currentBatch)->draws[(RLGL.currentBatch)->drawsCounter + -1].vertexCount;
        }
        else {
          local_10 = (RLGL.currentBatch)->draws[(RLGL.currentBatch)->drawsCounter + -1].vertexCount
                     % 4;
        }
        (RLGL.currentBatch)->draws[(RLGL.currentBatch)->drawsCounter + -1].vertexAlignment =
             local_10;
      }
      else if ((RLGL.currentBatch)->draws[(RLGL.currentBatch)->drawsCounter + -1].mode == 4) {
        if ((RLGL.currentBatch)->draws[(RLGL.currentBatch)->drawsCounter + -1].vertexCount < 4) {
          local_14 = 1;
        }
        else {
          local_14 = 4 - (RLGL.currentBatch)->draws[(RLGL.currentBatch)->drawsCounter + -1].
                         vertexCount % 4;
        }
        (RLGL.currentBatch)->draws[(RLGL.currentBatch)->drawsCounter + -1].vertexAlignment =
             local_14;
      }
      else {
        (RLGL.currentBatch)->draws[(RLGL.currentBatch)->drawsCounter + -1].vertexAlignment = 0;
      }
      _Var1 = rlCheckRenderBatchLimit
                        ((RLGL.currentBatch)->draws[(RLGL.currentBatch)->drawsCounter + -1].
                         vertexAlignment);
      if (!_Var1) {
        (RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].vCounter =
             (RLGL.currentBatch)->draws[(RLGL.currentBatch)->drawsCounter + -1].vertexAlignment +
             (RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].vCounter;
        (RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].cCounter =
             (RLGL.currentBatch)->draws[(RLGL.currentBatch)->drawsCounter + -1].vertexAlignment +
             (RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].cCounter;
        (RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].tcCounter =
             (RLGL.currentBatch)->draws[(RLGL.currentBatch)->drawsCounter + -1].vertexAlignment +
             (RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].tcCounter;
        (RLGL.currentBatch)->drawsCounter = (RLGL.currentBatch)->drawsCounter + 1;
      }
    }
    if (0xff < (RLGL.currentBatch)->drawsCounter) {
      rlDrawRenderBatch(RLGL.currentBatch);
    }
    (RLGL.currentBatch)->draws[(RLGL.currentBatch)->drawsCounter + -1].mode = mode;
    (RLGL.currentBatch)->draws[(RLGL.currentBatch)->drawsCounter + -1].vertexCount = 0;
    (RLGL.currentBatch)->draws[(RLGL.currentBatch)->drawsCounter + -1].textureId =
         RLGL.State.defaultTextureId;
  }
  return;
}

Assistant:

void rlBegin(int mode)
{
    // Draw mode can be RL_LINES, RL_TRIANGLES and RL_QUADS
    // NOTE: In all three cases, vertex are accumulated over default internal vertex buffer
    if (RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].mode != mode)
    {
        if (RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].vertexCount > 0)
        {
            // Make sure current RLGL.currentBatch->draws[i].vertexCount is aligned a multiple of 4,
            // that way, following QUADS drawing will keep aligned with index processing
            // It implies adding some extra alignment vertex at the end of the draw,
            // those vertex are not processed but they are considered as an additional offset
            // for the next set of vertex to be drawn
            if (RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].mode == RL_LINES) RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].vertexAlignment = ((RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].vertexCount < 4)? RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].vertexCount : RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].vertexCount%4);
            else if (RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].mode == RL_TRIANGLES) RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].vertexAlignment = ((RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].vertexCount < 4)? 1 : (4 - (RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].vertexCount%4)));
            else RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].vertexAlignment = 0;

            if (!rlCheckRenderBatchLimit(RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].vertexAlignment))
            {
                RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].vCounter += RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].vertexAlignment;
                RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].cCounter += RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].vertexAlignment;
                RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].tcCounter += RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].vertexAlignment;

                RLGL.currentBatch->drawsCounter++;
            }
        }

        if (RLGL.currentBatch->drawsCounter >= DEFAULT_BATCH_DRAWCALLS) rlDrawRenderBatch(RLGL.currentBatch);

        RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].mode = mode;
        RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].vertexCount = 0;
        RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].textureId = RLGL.State.defaultTextureId;
    }
}